

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenGlobalInitializer::GetOrCreateGlobalTarget
          (cmQtAutoGenGlobalInitializer *this,cmLocalGenerator *localGen,string *name,
          string *comment)

{
  bool bVar1;
  cmGeneratorTarget *pcVar2;
  pointer pcVar3;
  char *pcVar4;
  cmLocalGenerator *pcVar5;
  cmState *this_00;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  cmValue local_68;
  cmValue folder;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_58;
  cmLocalGenerator *local_50;
  cmTarget *target;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_38;
  __single_object cc;
  cmMakefile *makefile;
  string *comment_local;
  string *name_local;
  cmLocalGenerator *localGen_local;
  cmQtAutoGenGlobalInitializer *this_local;
  
  pcVar2 = cmLocalGenerator::FindGeneratorTargetToUse(localGen,name);
  if (pcVar2 == (cmGeneratorTarget *)0x0) {
    cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>._M_t.
    super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
    super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCustomCommand,_std::default_delete<cmCustomCommand>,_true,_true>)
         cmLocalGenerator::GetMakefile(localGen);
    std::make_unique<cmCustomCommand>();
    pcVar3 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                       (&local_38);
    cmMakefile::GetHomeOutputDirectory_abi_cxx11_
              ((cmMakefile *)
               cc._M_t.super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>.
               super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCustomCommand::SetWorkingDirectory(pcVar3,pcVar4);
    pcVar3 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                       (&local_38);
    cmCustomCommand::SetEscapeOldStyle(pcVar3,false);
    pcVar3 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                       (&local_38);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCustomCommand::SetComment(pcVar3,pcVar4);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
              (&local_58,&local_38);
    pcVar5 = (cmLocalGenerator *)cmLocalGenerator::AddUtilityCommand(localGen,name,true,&local_58);
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_58);
    local_50 = pcVar5;
    std::make_unique<cmGeneratorTarget,cmTarget*&,cmLocalGenerator*&>
              ((cmTarget **)&folder,&local_50);
    cmLocalGenerator::AddGeneratorTarget
              (localGen,(unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                        &folder);
    std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
              ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)&folder);
    this_00 = cmMakefile::GetState
                        ((cmMakefile *)
                         cc._M_t.
                         super___uniq_ptr_impl<cmCustomCommand,_std::default_delete<cmCustomCommand>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_cmCustomCommand_*,_std::default_delete<cmCustomCommand>_>
                         .super__Head_base<0UL,_cmCustomCommand_*,_false>._M_head_impl);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"AUTOGEN_TARGETS_FOLDER",&local_89);
    local_68 = cmState::GetGlobalProperty(this_00,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    bVar1 = cmValue::operator_cast_to_bool(&local_68);
    pcVar5 = local_50;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"FOLDER",&local_b1);
      cmTarget::SetProperty((cmTarget *)pcVar5,&local_b0,local_68);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
    }
    std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(&local_38);
  }
  return;
}

Assistant:

void cmQtAutoGenGlobalInitializer::GetOrCreateGlobalTarget(
  cmLocalGenerator* localGen, std::string const& name,
  std::string const& comment)
{
  // Test if the target already exists
  if (localGen->FindGeneratorTargetToUse(name) == nullptr) {
    cmMakefile const* makefile = localGen->GetMakefile();

    // Create utility target
    auto cc = cm::make_unique<cmCustomCommand>();
    cc->SetWorkingDirectory(makefile->GetHomeOutputDirectory().c_str());
    cc->SetEscapeOldStyle(false);
    cc->SetComment(comment.c_str());
    cmTarget* target = localGen->AddUtilityCommand(name, true, std::move(cc));
    localGen->AddGeneratorTarget(
      cm::make_unique<cmGeneratorTarget>(target, localGen));

    // Set FOLDER property in the target
    {
      cmValue folder =
        makefile->GetState()->GetGlobalProperty("AUTOGEN_TARGETS_FOLDER");
      if (folder) {
        target->SetProperty("FOLDER", folder);
      }
    }
  }
}